

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mcpl_fileutils.c
# Opt level: O3

mcu8str * mctools_determine_exe_self_path(mcu8str *__return_storage_ptr__,int argc,char **argv)

{
  bool bVar1;
  bool bVar2;
  int iVar3;
  ssize_t sVar4;
  char *__path;
  char buf [65537];
  char acStack_10038 [65544];
  
  bVar1 = true;
  while( true ) {
    __path = "/proc/curproc/file";
    if (bVar1) {
      __path = "/proc/self/exe";
    }
    __return_storage_ptr__->owns_memory = 0;
    __return_storage_ptr__->c_str = acStack_10038;
    __return_storage_ptr__->size = 0;
    __return_storage_ptr__->buflen = 0x10001;
    sVar4 = readlink(__path,acStack_10038,0x10000);
    if (sVar4 - 1U < 0xffff) break;
    mcu8str_dealloc(__return_storage_ptr__);
    bVar2 = !bVar1;
    bVar1 = false;
    if (bVar2) {
      if ((0 < argc) && (**argv == '/')) {
        mcu8str_create_from_cstr(__return_storage_ptr__,*argv);
        mctools_pathseps_platform(__return_storage_ptr__);
        iVar3 = mctools_is_file(__return_storage_ptr__);
        if (iVar3 != 0) {
LAB_001088fb:
          mctools_pathseps_platform(__return_storage_ptr__);
          return __return_storage_ptr__;
        }
        mcu8str_dealloc(__return_storage_ptr__);
      }
      __return_storage_ptr__->c_str = mcu8str_create_empty::dummy;
      __return_storage_ptr__->size = 0;
      __return_storage_ptr__->buflen = 0;
      __return_storage_ptr__->owns_memory = 0;
      return __return_storage_ptr__;
    }
  }
  acStack_10038[sVar4] = '\0';
  __return_storage_ptr__->size = (uint)sVar4;
  mcu8str_ensure_dynamic_buffer(__return_storage_ptr__);
  goto LAB_001088fb;
}

Assistant:

mcu8str mctools_determine_exe_self_path( int argc, char** argv )
  {
    //First try some platform specific methods not relying on argv0:
#ifdef MC_IS_WINDOWS
    {
      mcwinstr wpath = mc_winstr_create( (mcu8str_size_t)(MAX_PATH<32768
                                                          ?32768:MAX_PATH) +1 );
      DWORD nsize = GetModuleFileNameW(NULL, wpath.c_str, (DWORD)wpath.buflen );
      if ( nsize == 0 || (mcu8str_size_t)(nsize + 2) >= wpath.buflen ) {//+2 is safety
        //failure:
        mc_winstr_dealloc( &wpath );
      } else {
        //success:
        assert( (mcu8str_size_t)(nsize)+2 <= wpath.buflen );//+2 is safety
        wpath.c_str[nsize] = 0;//add null terminator
        wpath.size = nsize;
        mcu8str res = mc_winstr_to_u8str( &wpath );
        mc_winstr_dealloc( &wpath );
        mctools_pathseps_platform(&res);
        return res;
      }
    }
#endif
#ifdef MC_IS_APPLE
    {
      mcu8str path = mcu8str_create( 4096 );
      STDNS uint32_t bufsize = path.buflen;
      int status = _NSGetExecutablePath( path.c_str, &bufsize );
      if ( status == -1 ) {
        //buffer too small, try again
        mcu8str_reserve( &path, bufsize+1 );
        bufsize = path.buflen;
        status = _NSGetExecutablePath( path.c_str, &bufsize );
      }
      if ( status == 0 ) {
        //success! Return (but make sure we do not refer to our static buffer)
        mcu8str_update_size( &path );
        if ( path.size > 0 ) {
          mctools_pathseps_platform(&path);
          return path;
        }
      }
      mcu8str_dealloc(&path);
    }
#endif
#if defined(__unix__) && !defined(MC_IS_APPLE) && !defined(MC_IS_WINDOWS)
    {
      //Try to invoke readlink on relevant file in /proc. Investigate both
      //"/proc/self/exe" (linux) and "/proc/curproc/file" (might work on some
      //BSDs).
      for ( int ifile = 0; ifile < 2; ++ifile ) {
        const char * filename = ( ifile==0
                                  ? "/proc/self/exe"
                                  : "/proc/curproc/file" );

        char buf[65536+1];//PATH_MAX is unreliable so we use huge buffer for
        //simplicity.
        mcu8str path = mcu8str_create_from_staticbuffer( buf, sizeof(buf) );
        //NB: ssize_t is from unistd.h, so never exists in std:: namespace.
        ssize_t len = readlink(filename, path.c_str, path.buflen-1 );
        if ( len > 0 && (mcu8str_size_t)(len+1) < path.buflen ) {
          path.c_str[len] = '\0';//readlink does not add terminating null char
          path.size = (mcu8str_size_t)len;
          mcu8str_ensure_dynamic_buffer( &path );
          mctools_pathseps_platform(&path);
          return path;
        }
        mcu8str_dealloc(&path);
      }
    }
#endif
    //Fall back to argv0 analysis. This will probably only happen outside of the
    //three major platforms (win/macos/linux), so most likely this means we are
    //on some sort of BSD variant. If argv[0] is an absolute path and the file
    //at that path exists, we can take that as a somewhat reliable guess:

    if ( !(argc > 0) )
      return mcu8str_create_empty();//not available (rare, but allowed by C std)

    if ( argv[0][0] == '/' ) {
      //Looks like an absolute path:
      mcu8str path = mcu8str_create_from_cstr( argv[0] );
      mctools_pathseps_platform( &path );
      if ( mctools_is_file( &path ) ) {
        mctools_pathseps_platform(&path);
        return path;
      }
      mcu8str_dealloc( &path );
    }

    //We could do more extensive analysis here, but it might give wrong results
    //if we are unlucky.
    return mcu8str_create_empty();
  }